

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::MixedVertexBindingStrideCase::test
          (MixedVertexBindingStrideCase *this,ResultCollector *result)

{
  int iVar1;
  undefined4 extraout_var;
  CallLogWrapper gl;
  Buffer buffer;
  
  iVar1 = (*((this->super_IndexedCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext
            [3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar1),
             ((this->super_IndexedCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
             m_log);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&buffer,((this->super_IndexedCase).super_TestCase.m_context)->m_renderCtx);
  gl.m_enableLog = true;
  glu::CallLogWrapper::glBindBuffer(&gl,0x8892,buffer.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glVertexAttribPointer(&gl,1,4,0x1406,'\0',0xc,(void *)0x0);
  deqp::gls::StateQueryUtil::verifyStateIndexedInteger
            (result,&gl,0x82d8,1,0xc,(this->super_IndexedCase).m_verifier);
  glu::CallLogWrapper::glVertexAttribPointer(&gl,1,4,0x1406,'\0',0,(void *)0x0);
  deqp::gls::StateQueryUtil::verifyStateIndexedInteger
            (result,&gl,0x82d8,1,0x10,(this->super_IndexedCase).m_verifier);
  glu::ObjectWrapper::~ObjectWrapper(&buffer.super_ObjectWrapper);
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  return;
}

Assistant:

void MixedVertexBindingStrideCase::test (tcu::ResultCollector& result)
{
	glu::CallLogWrapper gl					(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	glu::Buffer			buffer				(m_context.getRenderContext());

	gl.enableLogging(true);

	gl.glBindBuffer(GL_ARRAY_BUFFER, *buffer);
	gl.glVertexAttribPointer(1, 4, GL_FLOAT, GL_FALSE, 12, 0);
	verifyStateIndexedInteger(result, gl, GL_VERTEX_BINDING_STRIDE, 1, 12, m_verifier);

	// test effectiveStride
	gl.glVertexAttribPointer(1, 4, GL_FLOAT, GL_FALSE, 0, 0);
	verifyStateIndexedInteger(result, gl, GL_VERTEX_BINDING_STRIDE, 1, 16, m_verifier);
}